

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

void loguru::set_thread_name(char *name)

{
  pthread_key_t __key;
  char *__pointer;
  
  pthread_once(&s_pthread_key_once,make_pthread_key_name);
  __key = s_pthread_key_name;
  __pointer = strdup(name);
  pthread_setspecific(__key,__pointer);
  return;
}

Assistant:

void set_thread_name(const char* name)
	{
		#if LOGURU_PTLS_NAMES
			(void)pthread_once(&s_pthread_key_once, make_pthread_key_name);
			(void)pthread_setspecific(s_pthread_key_name, STRDUP(name));

		#elif LOGURU_PTHREADS
			#ifdef __APPLE__
				pthread_setname_np(name);
			#elif defined(__FreeBSD__) || defined(__OpenBSD__)
				pthread_set_name_np(pthread_self(), name);
			#elif defined(__linux__)
				pthread_setname_np(pthread_self(), name);
			#endif
		#elif LOGURU_WINTHREADS
			strncpy_s(get_thread_name_win32(), LOGURU_THREADNAME_WIDTH + 1, name, _TRUNCATE);
		#else // LOGURU_PTHREADS
			(void)name;
		#endif // LOGURU_PTHREADS
	}